

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall duckdb::Vector::Slice(Vector *this,Vector *other,idx_t offset,idx_t end)

{
  VectorType VVar1;
  PhysicalType PVar2;
  ulong uVar3;
  LogicalType *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
  *this_01;
  Vector *pVVar4;
  idx_t iVar5;
  idx_t in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  idx_t array_size;
  Vector *other_child_vec;
  Vector *child_vec;
  Vector new_vector_1;
  idx_t i_1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *other_entries;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *entries;
  Vector new_vector;
  PhysicalType internal_type;
  idx_t i;
  SelectionVector sel;
  idx_t count;
  Vector *in_stack_fffffffffffffdf8;
  Vector *in_stack_fffffffffffffe00;
  data_ptr_t pdVar6;
  Vector *in_stack_fffffffffffffe08;
  Vector *in_stack_fffffffffffffe10;
  idx_t in_stack_fffffffffffffe18;
  SelectionVector *in_stack_fffffffffffffe20;
  idx_t in_stack_fffffffffffffe30;
  LogicalType *in_stack_fffffffffffffe38;
  pointer in_stack_fffffffffffffe40;
  Vector *in_stack_fffffffffffffe48;
  Vector *in_stack_fffffffffffffe50;
  Vector *this_02;
  Vector *local_f0;
  ulong local_48;
  idx_t in_stack_ffffffffffffffd8;
  
  VVar1 = GetVectorType(in_RSI);
  if (VVar1 == CONSTANT_VECTOR) {
    Reference(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  }
  else {
    VVar1 = GetVectorType(in_RSI);
    if (VVar1 == FLAT_VECTOR) {
      this_00 = GetType(in_RDI);
      PVar2 = LogicalType::InternalType(this_00);
      if (PVar2 == STRUCT) {
        GetType(in_RDI);
        LogicalType::LogicalType
                  ((LogicalType *)in_stack_fffffffffffffe00,(LogicalType *)in_stack_fffffffffffffdf8
                  );
        Vector(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        LogicalType::~LogicalType((LogicalType *)0x3dc3be);
        this_01 = &StructVector::GetEntries(in_stack_fffffffffffffdf8)->
                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
        ;
        StructVector::GetEntries((Vector *)0x3dc3ec);
        local_f0 = (Vector *)0x0;
        while (this_02 = local_f0,
              pVVar4 = (Vector *)
                       ::std::
                       vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ::size(this_01), this_02 < pVVar4) {
          in_stack_fffffffffffffe48 =
               (Vector *)
               vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                             *)in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8);
          in_stack_fffffffffffffe40 =
               unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                          in_stack_fffffffffffffe00);
          in_stack_fffffffffffffe38 =
               (LogicalType *)
               vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                             *)in_stack_fffffffffffffe00,(size_type)in_stack_fffffffffffffdf8);
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                    ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     in_stack_fffffffffffffe00);
          Slice(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
          local_f0 = (Vector *)&local_f0->field_0x1;
        }
        ValidityMask::Slice((ValidityMask *)this_02,(ValidityMask *)in_stack_fffffffffffffe48,
                            (idx_t)in_stack_fffffffffffffe40,(idx_t)in_stack_fffffffffffffe38);
        Reference(this_02,in_stack_fffffffffffffe48);
        ~Vector(in_stack_fffffffffffffe00);
      }
      else if (PVar2 == ARRAY) {
        GetType(in_RDI);
        LogicalType::LogicalType
                  ((LogicalType *)in_stack_fffffffffffffe00,(LogicalType *)in_stack_fffffffffffffdf8
                  );
        Vector(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        LogicalType::~LogicalType((LogicalType *)0x3dc5c0);
        ArrayVector::GetEntry((Vector *)0x3dc5cd);
        ArrayVector::GetEntry((Vector *)0x3dc5ee);
        GetType(in_RDI);
        ArrayType::GetSize((LogicalType *)in_stack_fffffffffffffe00);
        Slice(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
        ValidityMask::Slice((ValidityMask *)in_stack_fffffffffffffe50,
                            (ValidityMask *)in_stack_fffffffffffffe48,
                            (idx_t)in_stack_fffffffffffffe40,(idx_t)in_stack_fffffffffffffe38);
        Reference(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        ~Vector(in_stack_fffffffffffffe00);
      }
      else {
        Reference(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        if (in_RDX != (Vector *)0x0) {
          pdVar6 = in_RDI->data;
          iVar5 = GetTypeIdSize((PhysicalType)((ulong)in_stack_fffffffffffffe48 >> 0x38));
          in_RDI->data = pdVar6 + iVar5 * (long)in_RDX;
          ValidityMask::Slice((ValidityMask *)in_stack_fffffffffffffe50,
                              (ValidityMask *)in_stack_fffffffffffffe48,
                              (idx_t)in_stack_fffffffffffffe40,(idx_t)in_stack_fffffffffffffe38);
        }
      }
    }
    else {
      uVar3 = in_RCX - (long)in_RDX;
      SelectionVector::SelectionVector(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      for (local_48 = 0; local_48 < uVar3; local_48 = local_48 + 1) {
        SelectionVector::set_index
                  ((SelectionVector *)in_stack_fffffffffffffe10,(idx_t)in_stack_fffffffffffffe08,
                   (idx_t)in_stack_fffffffffffffe00);
      }
      Slice(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
            (SelectionVector *)in_stack_fffffffffffffe00,(idx_t)in_stack_fffffffffffffdf8);
      SelectionVector::~SelectionVector((SelectionVector *)0x3dc34d);
    }
  }
  return;
}

Assistant:

void Vector::Slice(const Vector &other, idx_t offset, idx_t end) {
	D_ASSERT(end >= offset);
	if (other.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		Reference(other);
		return;
	}
	if (other.GetVectorType() != VectorType::FLAT_VECTOR) {
		// we can slice the data directly only for flat vectors
		// for non-flat vectors slice using a selection vector instead
		idx_t count = end - offset;
		SelectionVector sel(count);
		for (idx_t i = 0; i < count; i++) {
			sel.set_index(i, offset + i);
		}
		Slice(other, sel, count);
		return;
	}

	auto internal_type = GetType().InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		Vector new_vector(GetType());
		auto &entries = StructVector::GetEntries(new_vector);
		auto &other_entries = StructVector::GetEntries(other);
		D_ASSERT(entries.size() == other_entries.size());
		for (idx_t i = 0; i < entries.size(); i++) {
			entries[i]->Slice(*other_entries[i], offset, end);
		}
		new_vector.validity.Slice(other.validity, offset, end - offset);
		Reference(new_vector);
	} else if (internal_type == PhysicalType::ARRAY) {
		Vector new_vector(GetType());
		auto &child_vec = ArrayVector::GetEntry(new_vector);
		auto &other_child_vec = ArrayVector::GetEntry(other);
		D_ASSERT(ArrayType::GetSize(GetType()) == ArrayType::GetSize(other.GetType()));
		const auto array_size = ArrayType::GetSize(GetType());
		// We need to slice the child vector with the multiplied offset and end
		child_vec.Slice(other_child_vec, offset * array_size, end * array_size);
		new_vector.validity.Slice(other.validity, offset, end - offset);
		Reference(new_vector);
	} else {
		Reference(other);
		if (offset > 0) {
			data = data + GetTypeIdSize(internal_type) * offset;
			validity.Slice(other.validity, offset, end - offset);
		}
	}
}